

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.cpp
# Opt level: O0

char * __thiscall crypto::arc4::crypt(arc4 *this,char *__key,char *__salt)

{
  char *in_RCX;
  size_t i;
  char *local_28;
  
  for (local_28 = (char *)0x0; local_28 < in_RCX; local_28 = local_28 + 1) {
    update((arc4 *)0x15f951);
    __salt[(long)local_28] =
         this->state[(long)(int)((uint)this->state[this->a] + (uint)this->state[this->b]) & 0xff] ^
         __key[(long)local_28];
  }
  return local_28;
}

Assistant:

void arc4::crypt(const char * in, char * out, size_t length) {
	
	for(size_t i = 0; i < length; i++) {
		update();
		out[i] = char(state[size_t(state[a] + state[b]) % sizeof(state)] ^ boost::uint8_t(in[i]));
	}
	
}